

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

JavascriptString *
Js::JavascriptArray::JoinHelper
          (Var thisArg,JavascriptString *separator,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  JavascriptArray *obj;
  JavascriptProxy *this;
  undefined4 *puVar7;
  bool *pbVar8;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  RecyclableObject *object;
  JavascriptNumberObject *object_00;
  JavascriptString *pJVar9;
  JavascriptNativeIntArray *arr;
  JavascriptNativeFloatArray *arr_00;
  undefined1 *local_a0;
  long local_98;
  RecyclableObject **local_90;
  bool *local_88;
  undefined1 **local_80;
  undefined1 local_78;
  RecyclableObject *local_70;
  Var target;
  JsReentLock jsReentLock;
  Var thisArg_local;
  ScriptContext *pSStack_38;
  bool isProxy;
  ScriptContext *scriptContext_local;
  
  target = scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)target)->noJsReentrancy;
  ((ThreadContext *)target)->noJsReentrancy = true;
  jsReentLock._24_8_ = thisArg;
  pSStack_38 = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)&target,thisArg);
  uVar3 = jsReentLock._24_8_;
  bVar4 = IsNonES5Array((Var)jsReentLock._24_8_);
  if (bVar4) {
    obj = UnsafeVarTo<Js::JavascriptArray>((Var)uVar3);
  }
  else {
    obj = (JavascriptArray *)0x0;
  }
  uVar3 = jsReentLock._24_8_;
  bVar4 = VarIs<Js::JavascriptProxy>((Var)jsReentLock._24_8_);
  if (bVar4) {
    this = UnsafeVarTo<Js::JavascriptProxy>((Var)uVar3);
  }
  else {
    this = (JavascriptProxy *)0x0;
  }
  if (obj == (JavascriptArray *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = pSStack_38 ==
            (((((obj->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
              javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  }
  if (this == (JavascriptProxy *)0x0) {
    thisArg_local._7_1_ = false;
  }
  else {
    thisArg_local._7_1_ =
         pSStack_38 ==
         (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
  }
  local_70 = (RecyclableObject *)0x0;
  if ((bool)thisArg_local._7_1_ == false) {
    BVar6 = ScriptContext::CheckObject(pSStack_38,(Var)jsReentLock._24_8_);
    if (BVar6 != 0) {
LAB_00b84783:
      pJVar9 = JavascriptLibrary::GetEmptyString
                         ((pSStack_38->super_ScriptContextBase).javascriptLibrary);
      goto LAB_00b8494e;
    }
LAB_00b84791:
    pbVar8 = &jsReentLock.m_savedNoJsReentrancy;
  }
  else {
    if (this == (JavascriptProxy *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x11c1,"(proxy)","proxy");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    local_70 = JavascriptProxy::GetTarget(this);
    if (local_70 == (RecyclableObject *)0x0) goto LAB_00b84791;
    BVar6 = ScriptContext::CheckObject(pSStack_38,local_70);
    if (BVar6 != 0) goto LAB_00b84783;
    pbVar8 = (bool *)&local_70;
  }
  ScriptContext::PushObject(pSStack_38,*(RecyclableObject **)pbVar8);
  uVar3 = jsReentLock._24_8_;
  local_a0 = (undefined1 *)&stack0xffffffffffffffc8;
  local_80 = &local_a0;
  local_98 = (long)&thisArg_local + 7;
  local_90 = &local_70;
  local_88 = &jsReentLock.m_savedNoJsReentrancy;
  local_78 = 1;
  if (bVar4) {
    if (jsReentLock._24_8_ != 0) {
      bVar4 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>((Var)jsReentLock._24_8_);
      if (bVar4) {
        this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>((Var)uVar3);
      }
      else {
        this_00 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
      }
      if (this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
      }
    }
    TVar1 = ((obj->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->typeId;
    if (TVar1 == TypeIds_ArrayLast) {
      *(undefined1 *)((long)target + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      arr_00 = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(obj);
      pJVar9 = JoinArrayHelper<Js::JavascriptNativeFloatArray>(arr_00,separator,pSStack_38);
      JsReentLock::MutateArrayObject((JsReentLock *)&target);
      goto LAB_00b84921;
    }
    if (TVar1 == TypeIds_NativeIntArray) {
      *(undefined1 *)((long)target + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      arr = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>(obj);
      pJVar9 = JoinArrayHelper<Js::JavascriptNativeIntArray>(arr,separator,pSStack_38);
      JsReentLock::MutateArrayObject((JsReentLock *)&target);
      goto LAB_00b84921;
    }
    if (TVar1 == TypeIds_Array) {
      *(undefined1 *)((long)target + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pJVar9 = JoinArrayHelper<Js::JavascriptArray>(obj,separator,pSStack_38);
      JsReentLock::MutateArrayObject((JsReentLock *)&target);
      goto LAB_00b84921;
    }
    pJVar9 = (JavascriptString *)0x0;
  }
  else {
    bVar4 = VarIs<Js::RecyclableObject>((Var)jsReentLock._24_8_);
    *(undefined1 *)((long)target + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if (bVar4) {
      object = VarTo<Js::RecyclableObject>((Var)jsReentLock._24_8_);
      pJVar9 = JoinOtherHelper(object,separator,pSStack_38);
      JsReentLock::MutateArrayObject((JsReentLock *)&target);
    }
    else {
      object_00 = JavascriptLibrary::CreateNumberObject
                            ((pSStack_38->super_ScriptContextBase).javascriptLibrary,
                             (Var)jsReentLock._24_8_);
      pJVar9 = JoinOtherHelper((RecyclableObject *)object_00,separator,pSStack_38);
      JsReentLock::MutateArrayObject((JsReentLock *)&target);
    }
LAB_00b84921:
    *(undefined1 *)((long)target + 0x108) = 1;
  }
  local_78 = 0;
  anon_func::FinallyObject::~FinallyObject((FinallyObject *)&local_80);
  if (pJVar9 == (JavascriptString *)0x0) {
    pJVar9 = JavascriptLibrary::GetEmptyString
                       ((pSStack_38->super_ScriptContextBase).javascriptLibrary);
  }
LAB_00b8494e:
  *(undefined1 *)((long)target + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pJVar9;
}

Assistant:

JavascriptString* JavascriptArray::JoinHelper(Var thisArg, JavascriptString* separator, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, thisArg);

        JavascriptArray * arr = JavascriptArray::TryVarToNonES5Array(thisArg);
        JavascriptProxy * proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(thisArg);
        bool isArray = arr && (scriptContext == arr->GetScriptContext());
        bool isProxy = proxy && (scriptContext == proxy->GetScriptContext());
        Var target = NULL;
        bool isTargetObjectPushed = false;
        // if we are visiting a proxy object, track that we have visited the target object as well so the next time w
        // call the join helper for the target of this proxy, we will return above.
        if (isProxy)
        {
            Assert(proxy);
            target = proxy->GetTarget();
            if (target != nullptr)
            {
                // If we end up joining same array, instead of going in infinite loop, return the empty string
                if (scriptContext->CheckObject(target))
                {
                    return scriptContext->GetLibrary()->GetEmptyString();
                }
                else
                {
                    scriptContext->PushObject(target);
                    isTargetObjectPushed = true;
                }
            }
        }
        // If we end up joining same array, instead of going in infinite loop, return the empty string
        else if (scriptContext->CheckObject(thisArg))
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        if (!isTargetObjectPushed)
        {
            scriptContext->PushObject(thisArg);
        }

        JavascriptString* res = nullptr;

        TryFinally([&]()
        {
            if (isArray)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray(thisArg);
#endif
                switch (arr->GetTypeId())
                {
                case Js::TypeIds_Array:
                    JS_REENTRANT(jsReentLock, res = JoinArrayHelper(arr, separator, scriptContext));
                    break;
                case Js::TypeIds_NativeIntArray:
                    JS_REENTRANT(jsReentLock, res = JoinArrayHelper(UnsafeVarTo<JavascriptNativeIntArray>(arr), separator, scriptContext));
                    break;
                case Js::TypeIds_NativeFloatArray:
                    JS_REENTRANT(jsReentLock, res = JoinArrayHelper(UnsafeVarTo<JavascriptNativeFloatArray>(arr), separator, scriptContext));
                    break;
                }

            }
            else if (VarIs<RecyclableObject>(thisArg))
            {
                JS_REENTRANT(jsReentLock, res = JoinOtherHelper(VarTo<RecyclableObject>(thisArg), separator, scriptContext));
            }
            else
            {
                JS_REENTRANT(jsReentLock, res = JoinOtherHelper(scriptContext->GetLibrary()->CreateNumberObject(thisArg), separator, scriptContext));
            }
        },
        [&](bool/*hasException*/)
        {
            Var top = scriptContext->PopObject();
            if (isProxy)
            {
                AssertMsg(top == target, "Unmatched operation stack");
            }
            else
            {
                AssertMsg(top == thisArg, "Unmatched operation stack");
            }
        });

        if (res == nullptr)
        {
            res = scriptContext->GetLibrary()->GetEmptyString();
        }

        return res;
    }